

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4m_video_source.h
# Opt level: O0

void __thiscall libaom_test::Y4mVideoSource::~Y4mVideoSource(Y4mVideoSource *this)

{
  unique_ptr<aom_image,_std::default_delete<aom_image>_> *in_RDI;
  Y4mVideoSource *in_stack_00000070;
  
  (in_RDI->_M_t).super___uniq_ptr_impl<aom_image,_std::default_delete<aom_image>_>._M_t.
  super__Tuple_impl<0UL,_aom_image_*,_std::default_delete<aom_image>_>.
  super__Head_base<0UL,_aom_image_*,_false>._M_head_impl =
       (aom_image *)&PTR__Y4mVideoSource_01f37c90;
  std::unique_ptr<aom_image,_std::default_delete<aom_image>_>::get(in_RDI);
  aom_img_free((aom_image_t *)0x3c7ac2);
  CloseSource(in_stack_00000070);
  std::unique_ptr<aom_image,_std::default_delete<aom_image>_>::~unique_ptr(in_RDI);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  VideoSource::~VideoSource((VideoSource *)in_RDI);
  return;
}

Assistant:

~Y4mVideoSource() override {
    aom_img_free(img_.get());
    CloseSource();
  }